

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

string_validator __thiscall
goodform::string_validator::match(string_validator *this,regex *expression)

{
  bool bVar1;
  allocator<char> local_69;
  string local_68;
  error_message local_48;
  regex *local_28;
  regex *expression_local;
  string_validator *this_local;
  string_validator ret;
  
  local_28 = expression;
  expression_local = (regex *)this;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (this->value_,expression,0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"STRING DOES NOT MATCH EXPRESSION",&local_69);
    error_message::error_message(&local_48,&local_68);
    error_message::operator=(this->error_,&local_48);
    error_message::~error_message(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return *this;
}

Assistant:

string_validator string_validator::match(std::regex expression)
  {
    if (!std::regex_match(this->value_, expression))
      this->error_ = error_message("STRING DOES NOT MATCH EXPRESSION");

    string_validator ret(*this);
    return ret;
  }